

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O3

void __thiscall irr::video::CNullDriver::deleteMaterialRenders(CNullDriver *this)

{
  int *piVar1;
  long *plVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  vector<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
  local_38;
  
  local_38.
  super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->MaterialRenderers).m_data.
       super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_38.
  super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->MaterialRenderers).m_data.
       super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if ((int)((ulong)((long)local_38.
                          super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_38.
                         super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333 != 0) {
    lVar5 = 0x20;
    uVar4 = 0;
    do {
      plVar2 = *(long **)((long)&((local_38.
                                   super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->Name).str._M_dataplus
                                 ._M_p + lVar5);
      if (plVar2 != (long *)0x0) {
        lVar3 = *(long *)(*plVar2 + -0x18);
        piVar1 = (int *)((long)plVar2 + lVar3 + 0x10);
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          (**(code **)(*(long *)((long)plVar2 + lVar3) + 8))();
          local_38.
          super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (this->MaterialRenderers).m_data.
               super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_38.
          super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (this->MaterialRenderers).m_data.
               super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
               ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x28;
    } while (uVar4 < (uint)((int)((ulong)((long)local_38.
                                                super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_38.
                                               super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                           -0x33333333));
  }
  local_38.
  super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->MaterialRenderers).m_data.
       super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->MaterialRenderers).m_data.
  super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->MaterialRenderers).m_data.
  super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->MaterialRenderers).m_data.
  super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
  ::~vector(&local_38);
  (this->MaterialRenderers).is_sorted = true;
  return;
}

Assistant:

void CNullDriver::deleteMaterialRenders()
{
	// delete material renderers
	for (u32 i = 0; i < MaterialRenderers.size(); ++i)
		if (MaterialRenderers[i].Renderer)
			MaterialRenderers[i].Renderer->drop();

	MaterialRenderers.clear();
}